

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__copyval(int channel,stbi_uc *dest,stbi_uc *src)

{
  int mask;
  uint uVar1;
  int i;
  long lVar2;
  
  uVar1 = 0x80;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    if ((uVar1 & channel) != 0) {
      dest[lVar2] = src[lVar2];
    }
    uVar1 = uVar1 >> 1;
  }
  return;
}

Assistant:

static void stbi__copyval(int channel,stbi_uc *dest,const stbi_uc *src)
{
   int mask=0x80,i;

   for (i=0;i<4; ++i, mask>>=1)
      if (channel&mask)
         dest[i]=src[i];
}